

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  uint uVar1;
  CellInfo info;
  CellInfo CStack_38;
  
  if (*pRC != 0) {
    return;
  }
  (*pPage->xParseCell)(pPage,pCell,&CStack_38);
  if (CStack_38.nLocal < CStack_38.nPayload) {
    uVar1 = *(uint *)(pCell + ((ulong)CStack_38.nSize - 4));
    ptrmapPut(pPage->pBt,
              uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18,'\x03'
              ,pPage->pgno,pRC);
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}